

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

node_type * __thiscall
Tree<NULLC::Range>::insert(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  void *pvVar1;
  int iVar2;
  node_type *pnVar3;
  int iVar4;
  
  if (node == (node_type *)0x0) {
    node = TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate(&this->pool);
    pvVar1 = key->end;
    (node->key).start = key->start;
    (node->key).end = pvVar1;
  }
  else {
    if (key->end < (node->key).start) {
      pnVar3 = insert(this,node->left,key);
      node->left = pnVar3;
    }
    else {
      pnVar3 = insert(this,node->right,key);
      node->right = pnVar3;
      pnVar3 = node->left;
    }
    iVar4 = 0;
    iVar2 = 0;
    if (pnVar3 != (node_type *)0x0) {
      iVar2 = pnVar3->height;
    }
    if (node->right != (node<NULLC::Range> *)0x0) {
      iVar4 = node->right->height;
    }
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    node->height = iVar4 + 1;
    iVar2 = get_balance(this,node);
    if (1 < iVar2) {
      pnVar3 = node->left;
      if ((pnVar3->key).start <= key->end) {
        if (key->start <= (pnVar3->key).end) {
          return node;
        }
        pnVar3 = left_rotate(this,pnVar3);
        node->left = pnVar3;
      }
      pnVar3 = right_rotate(this,node);
      return pnVar3;
    }
    if (iVar2 < -1) {
      pnVar3 = node->right;
      if (key->start <= (pnVar3->key).end) {
        if ((pnVar3->key).start <= key->end) {
          return node;
        }
        pnVar3 = right_rotate(this,pnVar3);
        node->right = pnVar3;
      }
      pnVar3 = left_rotate(this,node);
      return pnVar3;
    }
  }
  return node;
}

Assistant:

node_type* insert(node_type* node, const T& key)
	{
		if(node == NULL)
		{
			node_type *t = pool.Allocate();
			t->key = key;
			return t;
		}

		if(key < node->key)
			node->left = insert(node->left, key);
		else
			node->right = insert(node->right, key);

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && key < node->left->key)
			return right_rotate(node);

		if(balance < -1 && key > node->right->key)
			return left_rotate(node);

		if(balance > 1 && key > node->left->key)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && key < node->right->key)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}